

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_indirect_string.cpp
# Opt level: O2

void __thiscall
IndirectString_InMemoryEquality_Test::~IndirectString_InMemoryEquality_Test
          (IndirectString_InMemoryEquality_Test *this)

{
  anon_unknown.dwarf_1f9e83::IndirectString::~IndirectString(&this->super_IndirectString);
  operator_delete(this,0x150);
  return;
}

Assistant:

TEST_F (IndirectString, InMemoryEquality) {
    auto const view = pstore::make_sstring_view ("body");
    pstore::indirect_string const x (db_, &view);
    pstore::indirect_string const y (db_, &view);

    EXPECT_EQ (x.length (), 4U);
    EXPECT_EQ (y.length (), 4U);

    pstore::shared_sstring_view owner;
    EXPECT_EQ (x.as_string_view (&owner), "body");
    EXPECT_TRUE (x == y);
    EXPECT_FALSE (x != y);
}